

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper_posix.cpp
# Opt level: O3

long pstore::system_page_size::sysconf(int __name)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = getpagesize();
  if (0 < iVar1) {
    return CONCAT44(extraout_var,iVar1);
  }
  assert_failed("result > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/memory_mapper_posix.cpp"
                ,0x5f);
}

Assistant:

unsigned system_page_size::sysconf () {
#    ifdef PSTORE_HAVE_GETPAGESIZE
        int const result = getpagesize ();
        PSTORE_ASSERT (result > 0);
#    else
        long const result = ::sysconf (_SC_PAGESIZE);
        if (result == -1) {
            raise (errno_erc{errno}, "sysconf(_SC_PAGESIZE)");
        }
        PSTORE_ASSERT (result > 0 && result <= std::numeric_limits<unsigned>::max ());
#    endif // PSTORE_HAVE_GETPAGESIZE
        return static_cast<unsigned> (result);
    }